

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  bool bVar2;
  BMPReader bmpReader;
  string path;
  JPG jpg;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"start",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  path._M_dataplus._M_p = (pointer)&path.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&path,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/",
             "");
  jpg.data = (MCU *)&jpg.BMPData;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&jpg,path._M_dataplus._M_p,path._M_dataplus._M_p + path._M_string_length);
  std::__cxx11::string::append((char *)&jpg);
  std::__cxx11::string::operator=((string *)&path,(string *)&jpg);
  iVar1 = extraout_EDX;
  if (jpg.data != (MCU *)&jpg.BMPData) {
    operator_delete(jpg.data,(ulong)((long)&(jpg.BMPData)->field_0 + 1));
    iVar1 = extraout_EDX_00;
  }
  bmpReader.height = 0;
  bmpReader.width = 0;
  bmpReader.paddingBytes = 0;
  bmpReader.data = (RGB *)0x0;
  iVar1 = BMPReader::open(&bmpReader,(char *)&path,iVar1);
  bVar2 = (char)iVar1 == '\0';
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error - canot open file\n",0x18);
  }
  else {
    JPG::JPG(&jpg,bmpReader.width,bmpReader.height,bmpReader.data,'\x02','\x02','\x01','\x02','\x02'
             ,'\x01');
    JPG::convertToYCbCr(&jpg);
    JPG::subsampling(&jpg);
    printJPG(&jpg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"end",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    JPG::~JPG(&jpg);
  }
  if (bmpReader.data != (RGB *)0x0) {
    operator_delete__(bmpReader.data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar2;
}

Assistant:

int main() {
    std::cout << "start" << std::endl;
    std::string path(RESOURCE_PATH);
    path = path + "example.bmp";
    BMPReader bmpReader;
    if(!bmpReader.open(path)) {
        std::cout << "Error - canot open file\n" ;
        return 1;
    }
    JPG jpg(bmpReader.width, bmpReader.height, bmpReader.data, 2, 2, 1, 2, 2, 1) ;
    jpg.convertToYCbCr();
    jpg.subsampling();
    printJPG(jpg);

   // jpg.discreteCosineTransform();
   // jpg.quantization();
   // jpg.huffmanCoding();
   // std::string jpgPath(EXAMPLE_PATH_JPG);
   // jpg.output(jpgPath);
    std::cout << "end" << std::endl;
    return 0;
}